

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicCounter.h
# Opt level: O1

void __thiscall aeron::concurrent::AtomicCounter::~AtomicCounter(AtomicCounter *this)

{
  ~AtomicCounter(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AtomicCounter()
    {
        if (nullptr != m_countersManager)
        {
            m_countersManager->free(m_counterId);
        }
    }